

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,CastInstr *castInstr)

{
  Opcode opc;
  LiteralType LVar1;
  LiteralType LVar2;
  Value *value;
  _Hash_node_base *p_Var3;
  int iVar4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  long lVar11;
  undefined1 local_151;
  undefined1 local_150;
  undefined1 local_14f;
  undefined1 local_14e;
  undefined1 local_14d;
  undefined1 local_14c;
  undefined1 local_14b;
  undefined1 local_14a;
  undefined1 local_149;
  LiteralType local_148 [3];
  undefined2 local_13c;
  _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_138;
  _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_100;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  local_a8;
  pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
  local_68;
  
  if ((visit(flow::CastInstr&)::map == '\0') &&
     (iVar4 = __cxa_guard_acquire(&visit(flow::CastInstr&)::map), iVar4 != 0)) {
    local_148[1] = 3;
    local_b8 = 0x4600000006;
    uStack_b0 = 0x4700000007;
    local_c8 = 2;
    uStack_c4 = 0x44;
    uStack_c0 = 5;
    uStack_bc = 0x45;
    std::
    _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<flow::LiteralType_const,flow::Opcode>const*>
              ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&local_100,&local_c8,&local_a8,0,&local_149,&local_14a,&local_14b);
    std::
    pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
    ::pair<flow::LiteralType,_true>
              (&local_a8,local_148 + 1,
               (unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
                *)&local_100);
    local_148[0] = Number;
    local_148[2] = 3;
    local_13c = 0x48;
    std::
    _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<flow::LiteralType_const,flow::Opcode>const*>
              ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,flow::Opcode>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&local_138,local_148 + 2,&local_138,0,&local_14c,&local_14d,&local_14e);
    std::
    pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>
    ::pair<flow::LiteralType,_true>
              (&local_68,local_148,
               (unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>
                *)&local_138);
    std::
    _Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>,std::allocator<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _Hashtable<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>const*>
              ((_Hashtable<flow::LiteralType,std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>,std::allocator<std::pair<flow::LiteralType_const,std::unordered_map<flow::LiteralType,flow::Opcode,std::hash<flow::LiteralType>,std::equal_to<flow::LiteralType>,std::allocator<std::pair<flow::LiteralType_const,flow::Opcode>>>>>,std::__detail::_Select1st,std::equal_to<flow::LiteralType>,std::hash<flow::LiteralType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&visit::map,&local_a8,&stack0xffffffffffffffd8,0,&local_14f,&local_150,&local_151)
    ;
    lVar11 = 0x48;
    do {
      std::
      _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)((long)&local_a8.first + lVar11));
      lVar11 = lVar11 + -0x40;
    } while (lVar11 != -0x38);
    std::
    _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_138);
    std::
    _Hashtable<flow::LiteralType,_std::pair<const_flow::LiteralType,_flow::Opcode>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>,_std::__detail::_Select1st,_std::equal_to<flow::LiteralType>,_std::hash<flow::LiteralType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_100);
    __cxa_atexit(std::
                 unordered_map<flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_std::unordered_map<flow::LiteralType,_flow::Opcode,_std::hash<flow::LiteralType>,_std::equal_to<flow::LiteralType>,_std::allocator<std::pair<const_flow::LiteralType,_flow::Opcode>_>_>_>_>_>
                 ::~unordered_map,&visit::map,&__dso_handle);
    __cxa_guard_release(&visit(flow::CastInstr&)::map);
  }
  LVar1 = (castInstr->super_Instr).super_Value.type_;
  value = *(castInstr->super_Instr).operands_.
           super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  LVar2 = value->type_;
  if (LVar1 == LVar2) {
    emitLoad(this,value);
  }
  else {
    p_Var8 = visit::map._M_h._M_buckets[(ulong)LVar1 % visit::map._M_h._M_bucket_count];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var8->_M_nxt, p_Var10 = p_Var8,
       LVar1 != *(LiteralType *)&p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var5, p_Var5 = p_Var8->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)*(LiteralType *)&p_Var5[1]._M_nxt % visit::map._M_h._M_bucket_count !=
             (ulong)LVar1 % visit::map._M_h._M_bucket_count) ||
           (p_Var10 = p_Var8, LVar1 == *(LiteralType *)&p_Var5[1]._M_nxt)) goto LAB_0013f9c8;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_0013f9c8:
    if (p_Var10 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var10->_M_nxt;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      __assert_fail("i != map.end() && \"Cast target type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x200,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    uVar6 = (ulong)LVar2 % (ulong)p_Var5[3]._M_nxt;
    p_Var7 = p_Var5[2]._M_nxt[uVar6]._M_nxt;
    p_Var9 = (_Hash_node_base *)0x0;
    if ((p_Var7 != (_Hash_node_base *)0x0) &&
       (p_Var3 = p_Var7->_M_nxt, p_Var9 = p_Var7, LVar2 != *(LiteralType *)&p_Var7->_M_nxt[1]._M_nxt
       )) {
      while (p_Var7 = p_Var3, p_Var3 = p_Var7->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var9 = (_Hash_node_base *)0x0;
        if (((ulong)*(LiteralType *)&p_Var3[1]._M_nxt % (ulong)p_Var5[3]._M_nxt != uVar6) ||
           (p_Var9 = p_Var7, LVar2 == *(LiteralType *)&p_Var3[1]._M_nxt)) goto LAB_0013fa37;
      }
      p_Var9 = (_Hash_node_base *)0x0;
    }
LAB_0013fa37:
    if (p_Var9 == (_Hash_node_base *)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var9->_M_nxt;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      __assert_fail("k != sub.end() && \"Cast source type not found.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/TargetCodeGenerator.cc"
                    ,0x205,"virtual void flow::TargetCodeGenerator::visit(CastInstr &)");
    }
    opc = *(Opcode *)((long)&p_Var5[1]._M_nxt + 4);
    emitLoad(this,value);
    emitInstr(this,opc);
    changeStack(this,1,(Value *)castInstr);
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(CastInstr& castInstr) {
  // map of (target, source, opcode)
  static const std::unordered_map<
      LiteralType,
      std::unordered_map<LiteralType, Opcode>> map = {
        {LiteralType::String, {
          {LiteralType::Number, Opcode::N2S},
          {LiteralType::IPAddress, Opcode::P2S},
          {LiteralType::Cidr, Opcode::C2S},
          {LiteralType::RegExp, Opcode::R2S},
        }},
        {LiteralType::Number, {
          {LiteralType::String, Opcode::S2N},
        }},
      };

  // just alias same-type casts
  if (castInstr.type() == castInstr.source()->type()) {
    emitLoad(castInstr.source());
    return;
  }

  // lookup target type
  const auto i = map.find(castInstr.type());
  assert(i != map.end() && "Cast target type not found.");

  // lookup source type
  const auto& sub = i->second;
  auto k = sub.find(castInstr.source()->type());
  assert(k != sub.end() && "Cast source type not found.");
  Opcode op = k->second;

  // emit instruction
  emitLoad(castInstr.source());
  emitInstr(op);
  changeStack(1, &castInstr);
}